

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planar_functions.cc
# Opt level: O0

int ARGBBlend(uint8_t *src_argb0,int src_stride_argb0,uint8_t *src_argb1,int src_stride_argb1,
             uint8_t *dst_argb,int dst_stride_argb,int width,int height)

{
  ARGBBlendRow p_Var1;
  int in_ECX;
  uint8_t *in_RDX;
  int in_ESI;
  uint8_t *in_RDI;
  uint8_t *in_R8;
  int in_R9D;
  _func_void_uint8_t_ptr_uint8_t_ptr_uint8_t_ptr_int *ARGBBlendRow;
  int y;
  int local_38;
  int local_34;
  uint8_t *local_30;
  int local_24;
  uint8_t *local_20;
  int local_14;
  uint8_t *local_10;
  int local_4;
  
  p_Var1 = GetARGBBlend();
  if ((((in_RDI == (uint8_t *)0x0) || (in_RDX == (uint8_t *)0x0)) || (in_R8 == (uint8_t *)0x0)) ||
     (((int)ARGBBlendRow < 1 || (y == 0)))) {
    local_4 = -1;
  }
  else {
    local_34 = in_R9D;
    local_30 = in_R8;
    if (y < 0) {
      y = -y;
      local_30 = in_R8 + (y + -1) * in_R9D;
      local_34 = -in_R9D;
    }
    local_24 = in_ECX;
    local_14 = in_ESI;
    if (((in_ESI == (int)ARGBBlendRow << 2) && (in_ECX == (int)ARGBBlendRow << 2)) &&
       (local_34 == (int)ARGBBlendRow << 2)) {
      ARGBBlendRow._0_4_ = y * (int)ARGBBlendRow;
      y = 1;
      local_34 = 0;
      local_24 = 0;
      local_14 = 0;
    }
    local_20 = in_RDX;
    local_10 = in_RDI;
    for (local_38 = 0; local_38 < y; local_38 = local_38 + 1) {
      (*p_Var1)(local_10,local_20,local_30,(int)ARGBBlendRow);
      local_10 = local_10 + local_14;
      local_20 = local_20 + local_24;
      local_30 = local_30 + local_34;
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

LIBYUV_API
int ARGBBlend(const uint8_t* src_argb0,
              int src_stride_argb0,
              const uint8_t* src_argb1,
              int src_stride_argb1,
              uint8_t* dst_argb,
              int dst_stride_argb,
              int width,
              int height) {
  int y;
  void (*ARGBBlendRow)(const uint8_t* src_argb, const uint8_t* src_argb1,
                       uint8_t* dst_argb, int width) = GetARGBBlend();
  if (!src_argb0 || !src_argb1 || !dst_argb || width <= 0 || height == 0) {
    return -1;
  }
  // Negative height means invert the image.
  if (height < 0) {
    height = -height;
    dst_argb = dst_argb + (height - 1) * dst_stride_argb;
    dst_stride_argb = -dst_stride_argb;
  }
  // Coalesce rows.
  if (src_stride_argb0 == width * 4 && src_stride_argb1 == width * 4 &&
      dst_stride_argb == width * 4) {
    width *= height;
    height = 1;
    src_stride_argb0 = src_stride_argb1 = dst_stride_argb = 0;
  }

  for (y = 0; y < height; ++y) {
    ARGBBlendRow(src_argb0, src_argb1, dst_argb, width);
    src_argb0 += src_stride_argb0;
    src_argb1 += src_stride_argb1;
    dst_argb += dst_stride_argb;
  }
  return 0;
}